

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_Plane * __thiscall
ON_SubDMeshFragment::SideFrame
          (ON_Plane *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid_side_index)

{
  byte bVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint local_5c;
  uint S_dex1;
  uint S_dex;
  uint count;
  uint grid_side_index_local;
  ON_SubDMeshFragment *this_local;
  ON_Plane *side_frame;
  
  bVar1 = (this->m_grid).m_side_segment_count;
  uVar4 = (uint)bVar1;
  if (((grid_side_index < 4) && (uVar4 != 0)) && ((this->m_grid).m_S != (uint *)0x0)) {
    uVar5 = grid_side_index * uVar4 + (uint)(bVar1 >> 1);
    if (uVar5 < uVar4 << 2) {
      local_5c = uVar5 + 1;
    }
    else {
      local_5c = uVar5 - 1;
    }
    ON_Plane::ON_Plane(__return_storage_ptr__);
    puVar2 = (this->m_grid).m_S;
    bVar3 = Internal_GetFrameHelper(this,puVar2[uVar5],puVar2[local_5c],__return_storage_ptr__);
    if (bVar3) {
      return __return_storage_ptr__;
    }
    ON_Plane::~ON_Plane(__return_storage_ptr__);
  }
  memcpy(__return_storage_ptr__,&ON_Plane::NanPlane,0x80);
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDMeshFragment::SideFrame(unsigned int grid_side_index) const
{
  const unsigned int count = m_grid.m_side_segment_count;
  if (grid_side_index < 4U && count > 0 && nullptr != m_grid.m_S)
  {
    const unsigned int S_dex = grid_side_index * count + count / 2U;
    const unsigned int S_dex1 = (S_dex < (4U * count)) ? (S_dex + 1U) : (S_dex - 1U);
    ON_Plane side_frame;
    if (Internal_GetFrameHelper(m_grid.m_S[S_dex], m_grid.m_S[S_dex1], side_frame))
      return side_frame;
  }

  return ON_Plane::NanPlane;
}